

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O0

void jpeg_pipeline_dest(j_compress_ptr cinfo,uchar *outbuffer,size_t size,Pipeline *next)

{
  jpeg_destination_mgr *pjVar1;
  dct_pipeline_dest *dest;
  Pipeline *next_local;
  size_t size_local;
  uchar *outbuffer_local;
  j_compress_ptr cinfo_local;
  
  pjVar1 = (jpeg_destination_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x40);
  cinfo->dest = pjVar1;
  pjVar1 = cinfo->dest;
  pjVar1->init_destination = init_pipeline_destination;
  pjVar1->empty_output_buffer = empty_pipeline_output_buffer;
  pjVar1->term_destination = term_pipeline_destination;
  pjVar1[1].next_output_byte = outbuffer;
  pjVar1->next_output_byte = outbuffer;
  pjVar1[1].free_in_buffer = size;
  pjVar1->free_in_buffer = size;
  pjVar1[1].init_destination = (_func_void_j_compress_ptr *)next;
  return;
}

Assistant:

static void
jpeg_pipeline_dest(j_compress_ptr cinfo, unsigned char* outbuffer, size_t size, Pipeline* next)
{
    cinfo->dest = static_cast<struct jpeg_destination_mgr*>(
        // line-break
        (*cinfo->mem->alloc_small)(
            reinterpret_cast<j_common_ptr>(cinfo), JPOOL_PERMANENT, sizeof(dct_pipeline_dest)));
    auto* dest = reinterpret_cast<dct_pipeline_dest*>(cinfo->dest);
    dest->pub.init_destination = init_pipeline_destination;
    dest->pub.empty_output_buffer = empty_pipeline_output_buffer;
    dest->pub.term_destination = term_pipeline_destination;
    dest->pub.next_output_byte = dest->buffer = outbuffer;
    dest->pub.free_in_buffer = dest->size = size;
    dest->next = next;
}